

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O0

uint32_t anon_unknown.dwarf_899bb::threadCount(void)

{
  size_t sVar1;
  undefined8 uVar2;
  char *in_stack_00000008;
  imageException *in_stack_00000010;
  uint32_t count;
  
  ThreadPoolMonoid::instance();
  sVar1 = ThreadPool::threadCount((ThreadPool *)0x150051);
  if ((uint32_t)sVar1 == 0) {
    uVar2 = __cxa_allocate_exception(0x28);
    imageException::imageException(in_stack_00000010,in_stack_00000008);
    __cxa_throw(uVar2,&imageException::typeinfo,imageException::~imageException);
  }
  return (uint32_t)sVar1;
}

Assistant:

uint32_t threadCount()
    {
        const uint32_t count = static_cast<uint32_t>(ThreadPoolMonoid::instance().threadCount());
        if( count == 0 )
            throw imageException( "Thread Pool is not initialized." );
        return count;
    }